

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filterintra_sse4.c
# Opt level: O0

void filter_4xh(uint8_t *dest,ptrdiff_t stride,uint8_t *top_ptr,uint8_t *left_ptr,int mode,
               int height)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  void *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  ulong extraout_XMM0_Qa;
  ulong extraout_XMM0_Qa_00;
  ulong extraout_XMM0_Qa_01;
  uint8_t *dst;
  ulong extraout_XMM0_Qa_02;
  ulong extraout_XMM0_Qa_03;
  uint8_t *dst_00;
  ulong extraout_XMM0_Qa_04;
  ulong extraout_XMM0_Qa_05;
  ulong extraout_XMM0_Qa_06;
  ulong extraout_XMM0_Qa_07;
  long extraout_XMM0_Qb;
  long extraout_XMM0_Qb_00;
  ulong extraout_XMM0_Qb_01;
  ulong extraout_XMM0_Qb_02;
  __m128i *extraout_XMM0_Qb_03;
  long extraout_XMM0_Qb_04;
  ulong extraout_XMM0_Qb_05;
  ulong uVar16;
  ulong extraout_XMM0_Qb_06;
  ulong extraout_XMM0_Qb_07;
  ulong extraout_XMM0_Qb_08;
  __m128i keep_top_left;
  __m128i pixel_order2;
  int64_t kInsertTopLeftSecondMask;
  __m128i pixel_order1;
  int64_t kInsertTopLeftFirstMask;
  __m128i left;
  __m128i pixels;
  __m128i top;
  __m128i taps_6_7;
  __m128i taps_4_5;
  __m128i taps_2_3;
  __m128i taps_0_1;
  ulong local_368;
  long lStackY_360;
  ulong local_348;
  __m128i *in_stack_fffffffffffffce0;
  __m128i *in_stack_fffffffffffffce8;
  __m128i *taps_2_3_00;
  __m128i *in_stack_fffffffffffffcf0;
  __m128i *taps_0_1_00;
  __m128i *in_stack_fffffffffffffcf8;
  ptrdiff_t in_stack_fffffffffffffd00;
  ptrdiff_t stride_00;
  undefined1 local_2f8 [16];
  ulong uStack_2f0;
  void *local_260;
  __m128i *in_stack_fffffffffffffe60;
  
  xx_load_128(av1_filter_intra_taps + in_R8D);
  xx_load_128(av1_filter_intra_taps[in_R8D] + 2);
  xx_load_128(av1_filter_intra_taps[in_R8D] + 4);
  xx_load_128(av1_filter_intra_taps[in_R8D] + 6);
  xx_loadl_32((void *)(in_RDX + -1));
  if (in_R9D == 4) {
    xx_loadl_32(in_RCX);
    local_368 = extraout_XMM0_Qa;
    lStackY_360 = extraout_XMM0_Qb;
  }
  else {
    xx_loadl_64(in_RCX);
    local_368 = extraout_XMM0_Qa_00;
    lStackY_360 = extraout_XMM0_Qb_00;
  }
  local_2f8._0_8_ = (uint8_t *)(local_368 << 0x28);
  uStack_2f0 = lStackY_360 << 0x28 | local_368 >> 0x18;
  filter_4x2_sse4_1(local_2f8._0_8_,in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                    in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                    in_stack_fffffffffffffe60);
  xx_loadl_32((void *)(in_RDI + in_RSI));
  stride_00 = 0xf08070302010006;
  taps_2_3_00 = (__m128i *)0xf08070302010006;
  taps_0_1_00 = (__m128i *)0xf08070302010006;
  auVar15._8_8_ = uStack_2f0 | extraout_XMM0_Qb_01;
  auVar15._0_8_ = (ulong)local_2f8._0_8_ | extraout_XMM0_Qa_01;
  auVar14._8_8_ = 0xf08070302010006;
  auVar14._0_8_ = 0xf08070302010006;
  pshufb(auVar15,auVar14);
  local_260 = (void *)(in_RSI * 2 + in_RDI + in_RSI);
  filter_4x2_sse4_1(local_2f8._0_8_,0xf08070302010006,in_stack_fffffffffffffcf8,
                    (__m128i *)0xf08070302010006,(__m128i *)0xf08070302010006,
                    in_stack_fffffffffffffce0,in_stack_fffffffffffffe60);
  if (in_R9D == 0x10) {
    dst = (uint8_t *)(local_368 << 0x30);
    uVar1 = uStack_2f0 << 8;
    uStack_2f0 = uVar1 | (ulong)local_2f8._0_8_ >> 0x38;
    local_2f8._0_8_ = dst;
    xx_loadl_32(local_260);
    in_stack_fffffffffffffce0 = (__m128i *)0xf0b0a0302010009;
    auVar13._8_8_ = uStack_2f0 | extraout_XMM0_Qb_02;
    auVar13._0_8_ = (ulong)dst | extraout_XMM0_Qa_02;
    auVar12._8_8_ = 0xf0b0a0302010009;
    auVar12._0_8_ = 0xf0b0a0302010009;
    pshufb(auVar13,auVar12);
    local_260 = (void *)((long)local_260 + in_RSI * 2);
    filter_4x2_sse4_1(dst,stride_00,in_stack_fffffffffffffcf8,taps_0_1_00,taps_2_3_00,
                      (__m128i *)0xf0b0a0302010009,in_stack_fffffffffffffe60);
    xx_loadl_32(local_260);
    local_2f8._0_8_ = local_2f8._2_8_;
    uStack_2f0 = uVar1 >> 0x10;
    in_stack_fffffffffffffe60 = extraout_XMM0_Qb_03;
    xx_loadl_64((void *)((long)in_RCX + 8));
    auVar11._8_8_ = uStack_2f0 | (ulong)extraout_XMM0_Qb_03;
    auVar11._0_8_ = (ulong)local_2f8._0_8_ | extraout_XMM0_Qa_03;
    auVar10._8_8_ = 0xf0b0a0302010009;
    auVar10._0_8_ = 0xf0b0a0302010009;
    pshufb(auVar11,auVar10);
    local_260 = (void *)((long)local_260 + in_RSI * 2);
    filter_4x2_sse4_1(dst_00,stride_00,in_stack_fffffffffffffcf8,taps_0_1_00,taps_2_3_00,
                      in_stack_fffffffffffffce0,in_stack_fffffffffffffe60);
    local_348 = uVar1 >> 0x28;
    xx_loadl_32(local_260);
    uVar16 = extraout_XMM0_Qb_04 << 0x38 | (ulong)dst_00 >> 8;
    local_2f8._0_8_ = (uint8_t *)((long)dst_00 << 0x38 | local_348 << 0x30);
    uStack_2f0 = uVar16 | uVar1 >> 0x38;
    auVar9._8_8_ = uStack_2f0 | extraout_XMM0_Qb_05;
    auVar9._0_8_ = (ulong)local_2f8._0_8_ | extraout_XMM0_Qa_04;
    auVar8._8_8_ = taps_0_1_00;
    auVar8._0_8_ = taps_2_3_00;
    pshufb(auVar9,auVar8);
    local_260 = (void *)((long)local_260 + in_RSI * 2);
    filter_4x2_sse4_1(local_2f8._0_8_,stride_00,in_stack_fffffffffffffcf8,taps_0_1_00,taps_2_3_00,
                      in_stack_fffffffffffffce0,in_stack_fffffffffffffe60);
    xx_loadl_32(local_260);
    local_2f8._0_8_ = local_2f8._2_8_;
    uStack_2f0 = uVar16 >> 0x10;
    auVar7._8_8_ = uStack_2f0 | extraout_XMM0_Qb_06;
    auVar7._0_8_ = (ulong)local_2f8._0_8_ | extraout_XMM0_Qa_05;
    auVar6._8_8_ = taps_0_1_00;
    auVar6._0_8_ = taps_2_3_00;
    pshufb(auVar7,auVar6);
    local_260 = (void *)(in_RSI * 2 + (long)local_260);
    filter_4x2_sse4_1(local_2f8._0_8_,stride_00,in_stack_fffffffffffffcf8,taps_0_1_00,taps_2_3_00,
                      in_stack_fffffffffffffce0,in_stack_fffffffffffffe60);
    uStack_2f0 = uVar16 >> 0x10;
  }
  uVar1 = uStack_2f0;
  if (4 < in_R9D) {
    local_2f8._0_8_ = (uint8_t *)(uStack_2f0 << 0x30);
    uStack_2f0 = uStack_2f0 >> 0x10;
    xx_loadl_32(local_260);
    auVar5._8_8_ = uStack_2f0 | extraout_XMM0_Qb_07;
    auVar5._0_8_ = (ulong)local_2f8._0_8_ | extraout_XMM0_Qa_06;
    auVar4._8_8_ = taps_0_1_00;
    auVar4._0_8_ = taps_2_3_00;
    pshufb(auVar5,auVar4);
    filter_4x2_sse4_1(local_2f8._0_8_,stride_00,in_stack_fffffffffffffcf8,taps_0_1_00,taps_2_3_00,
                      in_stack_fffffffffffffce0,in_stack_fffffffffffffe60);
    xx_loadl_32((void *)((long)local_260 + in_RSI * 2));
    local_2f8._0_8_ = local_2f8._2_8_;
    uStack_2f0 = uVar1 >> 0x20;
    auVar3._8_8_ = uStack_2f0 | extraout_XMM0_Qb_08;
    auVar3._0_8_ = (ulong)local_2f8._0_8_ | extraout_XMM0_Qa_07;
    auVar2._8_8_ = taps_0_1_00;
    auVar2._0_8_ = taps_2_3_00;
    pshufb(auVar3,auVar2);
    filter_4x2_sse4_1(local_2f8._0_8_,stride_00,in_stack_fffffffffffffcf8,taps_0_1_00,taps_2_3_00,
                      in_stack_fffffffffffffce0,in_stack_fffffffffffffe60);
  }
  return;
}

Assistant:

static inline void filter_4xh(uint8_t *dest, ptrdiff_t stride,
                              const uint8_t *const top_ptr,
                              const uint8_t *const left_ptr, int mode,
                              const int height) {
  const __m128i taps_0_1 = xx_load_128(av1_filter_intra_taps[mode][0]);
  const __m128i taps_2_3 = xx_load_128(av1_filter_intra_taps[mode][2]);
  const __m128i taps_4_5 = xx_load_128(av1_filter_intra_taps[mode][4]);
  const __m128i taps_6_7 = xx_load_128(av1_filter_intra_taps[mode][6]);
  __m128i top = xx_loadl_32(top_ptr - 1);
  __m128i pixels = _mm_insert_epi8(top, (int8_t)top_ptr[3], 4);
  __m128i left = (height == 4 ? xx_loadl_32(left_ptr) : xx_loadl_64(left_ptr));
  left = _mm_slli_si128(left, 5);

  // Relative pixels: top[-1], top[0], top[1], top[2], top[3], left[0], left[1],
  // left[2], left[3], left[4], left[5], left[6], left[7]
  pixels = _mm_or_si128(left, pixels);

  // Duplicate first 8 bytes.
  pixels = _mm_shuffle_epi32(pixels, DUPLICATE_FIRST_HALF);
  filter_4x2_sse4_1(dest, stride, &pixels, &taps_0_1, &taps_2_3, &taps_4_5,
                    &taps_6_7);
  dest += stride;  // Move to y = 1.
  pixels = xx_loadl_32(dest);

  // Relative pixels: top[0], top[1], top[2], top[3], empty, left[-2], left[-1],
  // left[0], left[1], ...
  pixels = _mm_or_si128(left, pixels);

  // This mask rearranges bytes in the order: 6, 0, 1, 2, 3, 7, 8, 15. The last
  // byte is an unused value, which shall be multiplied by 0 when we apply the
  // filter.
  const int64_t kInsertTopLeftFirstMask = 0x0F08070302010006;

  // Insert left[-1] in front as TL and put left[0] and left[1] at the end.
  const __m128i pixel_order1 = _mm_set1_epi64x(kInsertTopLeftFirstMask);
  pixels = _mm_shuffle_epi8(pixels, pixel_order1);
  dest += stride;  // Move to y = 2.
  filter_4x2_sse4_1(dest, stride, &pixels, &taps_0_1, &taps_2_3, &taps_4_5,
                    &taps_6_7);
  dest += stride;  // Move to y = 3.

  // Compute the middle 8 rows before using common code for the final 4 rows.
  // Because the common code below this block assumes that
  if (height == 16) {
    // This shift allows us to use pixel_order2 twice after shifting by 2 later.
    left = _mm_slli_si128(left, 1);
    pixels = xx_loadl_32(dest);

    // Relative pixels: top[0], top[1], top[2], top[3], empty, empty, left[-4],
    // left[-3], left[-2], left[-1], left[0], left[1], left[2], left[3]
    pixels = _mm_or_si128(left, pixels);

    // This mask rearranges bytes in the order: 9, 0, 1, 2, 3, 7, 8, 15. The
    // last byte is an unused value, as above. The top-left was shifted to
    // position nine to keep two empty spaces after the top pixels.
    const int64_t kInsertTopLeftSecondMask = 0x0F0B0A0302010009;

    // Insert (relative) left[-1] in front as TL and put left[0] and left[1] at
    // the end.
    const __m128i pixel_order2 = _mm_set1_epi64x(kInsertTopLeftSecondMask);
    pixels = _mm_shuffle_epi8(pixels, pixel_order2);
    dest += stride;  // Move to y = 4.

    // First 4x2 in the if body.
    filter_4x2_sse4_1(dest, stride, &pixels, &taps_0_1, &taps_2_3, &taps_4_5,
                      &taps_6_7);

    // Clear all but final pixel in the first 8 of left column.
    __m128i keep_top_left = _mm_srli_si128(left, 13);
    dest += stride;  // Move to y = 5.
    pixels = xx_loadl_32(dest);
    left = _mm_srli_si128(left, 2);

    // Relative pixels: top[0], top[1], top[2], top[3], left[-6],
    // left[-5], left[-4], left[-3], left[-2], left[-1], left[0], left[1]
    pixels = _mm_or_si128(left, pixels);
    left = xx_loadl_64(left_ptr + 8);

    pixels = _mm_shuffle_epi8(pixels, pixel_order2);
    dest += stride;  // Move to y = 6.

    // Second 4x2 in the if body.
    filter_4x2_sse4_1(dest, stride, &pixels, &taps_0_1, &taps_2_3, &taps_4_5,
                      &taps_6_7);

    // Position TL value so we can use pixel_order1.
    keep_top_left = _mm_slli_si128(keep_top_left, 6);
    dest += stride;  // Move to y = 7.
    pixels = xx_loadl_32(dest);
    left = _mm_slli_si128(left, 7);
    left = _mm_or_si128(left, keep_top_left);

    // Relative pixels: top[0], top[1], top[2], top[3], empty, empty,
    // left[-1], left[0], left[1], left[2], left[3], ...
    pixels = _mm_or_si128(left, pixels);
    pixels = _mm_shuffle_epi8(pixels, pixel_order1);
    dest += stride;  // Move to y = 8.

    // Third 4x2 in the if body.
    filter_4x2_sse4_1(dest, stride, &pixels, &taps_0_1, &taps_2_3, &taps_4_5,
                      &taps_6_7);
    dest += stride;  // Move to y = 9.

    // Prepare final inputs.
    pixels = xx_loadl_32(dest);
    left = _mm_srli_si128(left, 2);

    // Relative pixels: top[0], top[1], top[2], top[3], left[-3], left[-2]
    // left[-1], left[0], left[1], left[2], left[3], ...
    pixels = _mm_or_si128(left, pixels);
    pixels = _mm_shuffle_epi8(pixels, pixel_order1);
    dest += stride;  // Move to y = 10.

    // Fourth 4x2 in the if body.
    filter_4x2_sse4_1(dest, stride, &pixels, &taps_0_1, &taps_2_3, &taps_4_5,
                      &taps_6_7);
    dest += stride;  // Move to y = 11.
  }

  // In both the 8 and 16 case, we assume that the left vector has the next TL
  // at position 8.
  if (height > 4) {
    // Erase prior left pixels by shifting TL to position 0.
    left = _mm_srli_si128(left, 8);
    left = _mm_slli_si128(left, 6);
    pixels = xx_loadl_32(dest);

    // Relative pixels: top[0], top[1], top[2], top[3], empty, empty,
    // left[-1], left[0], left[1], left[2], left[3], ...
    pixels = _mm_or_si128(left, pixels);
    pixels = _mm_shuffle_epi8(pixels, pixel_order1);
    dest += stride;  // Move to y = 12 or 4.

    // First of final two 4x2 blocks.
    filter_4x2_sse4_1(dest, stride, &pixels, &taps_0_1, &taps_2_3, &taps_4_5,
                      &taps_6_7);
    dest += stride;  // Move to y = 13 or 5.
    pixels = xx_loadl_32(dest);
    left = _mm_srli_si128(left, 2);

    // Relative pixels: top[0], top[1], top[2], top[3], left[-3], left[-2]
    // left[-1], left[0], left[1], left[2], left[3], ...
    pixels = _mm_or_si128(left, pixels);
    pixels = _mm_shuffle_epi8(pixels, pixel_order1);
    dest += stride;  // Move to y = 14 or 6.

    // Last of final two 4x2 blocks.
    filter_4x2_sse4_1(dest, stride, &pixels, &taps_0_1, &taps_2_3, &taps_4_5,
                      &taps_6_7);
  }
}